

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O3

void __thiscall
dynamicgraph::SignalArray_const<int>::SignalArray_const
          (SignalArray_const<int> *this,SignalArray<int> *siga)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined8 local_28;
  
  local_28._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  this->_vptr_SignalArray_const = (_func_int **)&PTR__SignalArray_const_00129be0;
  uVar1 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[4])(siga);
  std::
  vector<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::vector(&this->const_array,(ulong)uVar1,(allocator_type *)((long)&local_28 + 7));
  uVar1 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[4])(siga);
  this->size = uVar1;
  uVar1 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[4])(siga);
  this->rank = uVar1;
  local_28 = (ulong)local_28._4_4_ << 0x20;
  if (uVar1 != 0) {
    do {
      iVar2 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[3])(siga,&local_28);
      (this->const_array).
      super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[local_28 & 0xffffffff] =
           (SignalBase<int> *)CONCAT44(extraout_var,iVar2);
      uVar1 = (int)local_28 + 1;
      local_28 = CONCAT44(local_28._4_4_,uVar1);
    } while (uVar1 < this->rank);
  }
  return;
}

Assistant:

SignalArray_const<Time>(const SignalArray<Time> &siga)
      : const_array(siga.getSize()),
        size(siga.getSize()),
        rank(siga.getSize()) {
    for (unsigned int i = 0; i < rank; ++i) const_array[i] = &siga[i];
  }